

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O1

CURLcode smtp_statemachine(Curl_easy *data,connectdata *conn)

{
  anon_union_280_10_9f9d5394_for_proto *pp;
  ushort *puVar1;
  uint uVar2;
  SMTP *pSVar3;
  curl_slist *pcVar4;
  byte bVar5;
  _Bool _Var6;
  unsigned_short uVar7;
  CURLcode CVar8;
  smtp_conn *smtpc;
  ulong uVar9;
  ulong uVar10;
  smtpstate sVar11;
  char *pcVar12;
  byte *pbVar13;
  byte *pbVar14;
  long lVar15;
  bool bVar16;
  int smtpcode;
  size_t nread;
  saslprogress local_50;
  undefined4 uStack_4c;
  uint local_44;
  dynbuf *local_40;
  size_t local_38;
  
  local_38 = 0;
  if ((conn->proto).smtpc.state == SMTP_UPGRADETLS) {
LAB_00157e78:
    CVar8 = smtp_perform_upgrade_tls(data);
    return CVar8;
  }
  pp = &conn->proto;
  local_40 = &(conn->proto).ftpc.pp.recvbuf;
LAB_00157ea3:
  if ((conn->proto).ftpc.pp.sendleft != 0) {
    CVar8 = Curl_pp_flushsend(data,&(pp->ftpc).pp);
    return CVar8;
  }
  do {
    CVar8 = Curl_pp_readresp(data,0,&(pp->ftpc).pp,(int *)&local_44,&local_38);
    uVar2 = local_44;
    if (CVar8 != CURLE_OK) {
      return CVar8;
    }
    sVar11 = (conn->proto).smtpc.state;
    if (local_44 != 1 && sVar11 != SMTP_QUIT) {
      (data->info).httpcode = local_44;
    }
    if (local_44 == 0) {
      return CURLE_OK;
    }
    switch(sVar11) {
    case SMTP_SERVERGREET:
      if (local_44 - 200 < 100) {
        CVar8 = smtp_perform_ehlo(data);
      }
      else {
        pcVar12 = "Got unexpected smtp-server response: %d";
LAB_0015817b:
        Curl_failf(data,pcVar12,(ulong)uVar2);
        CVar8 = CURLE_WEIRD_SERVER_REPLY;
      }
      break;
    case SMTP_EHLO:
      bVar16 = local_44 == 1;
      pcVar12 = Curl_dyn_ptr(local_40);
      if (0xffffff9b < uVar2 - 300 || bVar16) {
        uVar9 = (conn->proto).ftpc.pp.nfinal;
        if (uVar9 < 4) {
          Curl_failf(data,"Unexpectedly short EHLO response");
          CVar8 = CURLE_WEIRD_SERVER_REPLY;
          break;
        }
        uVar10 = uVar9 - 4;
        if ((uVar10 < 8) || (*(long *)(pcVar12 + 4) != 0x534c545452415453)) {
          if ((3 < uVar10) && (*(int *)(pcVar12 + 4) == 0x455a4953)) {
            bVar5 = 4;
            goto LAB_001584a5;
          }
          if ((7 < uVar10) && (*(long *)(pcVar12 + 4) == 0x3846545550544d53)) {
            bVar5 = 8;
            goto LAB_001584a5;
          }
          if ((4 < uVar10) && (pcVar12[8] == ' ' && *(int *)(pcVar12 + 4) == 0x48545541)) {
            pbVar13 = (byte *)((long)&conn->proto + 0xd0);
            *pbVar13 = *pbVar13 | 0x10;
            lVar15 = uVar9 - 9;
            pbVar13 = (byte *)(pcVar12 + 9);
LAB_00158230:
            bVar16 = lVar15 == 0;
            pbVar14 = pbVar13;
            if (!bVar16) {
              pbVar14 = pbVar13 + lVar15;
              lVar15 = -lVar15;
              bVar16 = false;
              do {
                if ((0x20 < (ulong)*pbVar13) ||
                   ((0x100002600U >> ((ulong)*pbVar13 & 0x3f) & 1) == 0)) {
                  uVar9 = 0;
                  goto LAB_00158283;
                }
                pbVar13 = pbVar13 + 1;
                lVar15 = lVar15 + 1;
                bVar16 = lVar15 == 0;
              } while (!bVar16);
            }
            lVar15 = 0;
            goto LAB_00158270;
          }
        }
        else {
          bVar5 = 2;
LAB_001584a5:
          pbVar13 = (byte *)((long)&conn->proto + 0xd0);
          *pbVar13 = *pbVar13 | bVar5;
        }
LAB_001584b0:
        if (uVar2 == 1) {
          CVar8 = CURLE_OK;
        }
        else if (((data->set).use_ssl == '\0') || (_Var6 = Curl_conn_is_ssl(conn,0), _Var6)) {
LAB_001584d2:
          CVar8 = smtp_perform_authentication(data);
        }
        else if ((*(byte *)((long)&conn->proto + 0xd0) & 2) == 0) {
          if ((data->set).use_ssl == '\x01') goto LAB_001584d2;
          Curl_failf(data,"STARTTLS not supported.");
          CVar8 = CURLE_USE_SSL_FAILED;
        }
        else {
          CVar8 = smtp_perform_starttls(data,conn);
        }
        break;
      }
      if ((1 < (data->set).use_ssl) && (_Var6 = Curl_conn_is_ssl(conn,0), !_Var6))
      goto LAB_00158155;
      *(undefined2 *)((long)&conn->proto + 0xbc) = 0;
      CVar8 = Curl_pp_sendf(data,&(pp->ftpc).pp,"HELO %s",(conn->proto).ftpc.newhost);
      if (CVar8 != CURLE_OK) break;
      sVar11 = SMTP_HELO;
      goto LAB_0015814b;
    case SMTP_HELO:
      if (local_44 - 200 < 100) goto switchD_00157f11_caseD_5;
LAB_00158155:
      Curl_failf(data,"Remote access denied: %d",(ulong)uVar2);
      CVar8 = CURLE_REMOTE_ACCESS_DENIED;
      break;
    case SMTP_STARTTLS:
      CVar8 = CURLE_WEIRD_SERVER_REPLY;
      if ((data->conn->proto).ftpc.pp.overflow == 0) {
        if (local_44 == 0xdc) {
          CVar8 = smtp_perform_upgrade_tls(data);
        }
        else if ((data->set).use_ssl == '\x01') {
          CVar8 = smtp_perform_authentication(data);
        }
        else {
          Curl_failf(data,"STARTTLS denied, code %d",(ulong)local_44);
          CVar8 = CURLE_USE_SSL_FAILED;
        }
      }
      if (CVar8 == CURLE_OK) {
        if ((conn->proto).smtpc.state == SMTP_UPGRADETLS) goto LAB_0015854a;
LAB_00158496:
        CVar8 = CURLE_OK;
      }
      break;
    default:
switchD_00157f11_caseD_5:
      CVar8 = CURLE_OK;
      goto LAB_00158146;
    case SMTP_AUTH:
      CVar8 = Curl_sasl_continue(&(data->conn->proto).imapc.sasl,data,local_44,&local_50);
      if (CVar8 == CURLE_OK) {
        if (local_50 == SASL_IDLE) {
          Curl_failf(data,"Authentication cancelled");
          CVar8 = CURLE_LOGIN_DENIED;
        }
        else {
          CVar8 = CURLE_OK;
          if (local_50 == SASL_DONE) goto switchD_00157f11_caseD_5;
        }
      }
      break;
    case SMTP_COMMAND:
      pSVar3 = (data->req).p.smtp;
      pcVar12 = Curl_dyn_ptr(&(data->conn->proto).ftpc.pp.recvbuf);
      if ((((uVar2 - 300 < 0xffffff9c && pSVar3->rcpt != (curl_slist *)0x0) && (uVar2 != 0x229)) &&
          (uVar2 != 1)) ||
         (((uVar2 - 300 < 0xffffff9c && (uVar2 != 1)) && (pSVar3->rcpt == (curl_slist *)0x0)))) {
        pcVar12 = "Command failed: %d";
        goto LAB_0015817b;
      }
      CVar8 = CURLE_OK;
      if (((data->req).field_0xdb & 2) == 0) {
        CVar8 = Curl_client_write(data,1,pcVar12,(data->conn->proto).ftpc.pp.nfinal);
      }
      if (uVar2 != 1) {
        if ((pSVar3->rcpt == (curl_slist *)0x0) ||
           (pcVar4 = pSVar3->rcpt->next, pSVar3->rcpt = pcVar4, pcVar4 == (curl_slist *)0x0))
        goto LAB_00158146;
        CVar8 = smtp_perform_command(data);
      }
      break;
    case SMTP_MAIL:
      if (local_44 - 200 < 100) {
LAB_0015834c:
        CVar8 = smtp_perform_rcpt_to(data);
      }
      else {
        pcVar12 = "MAIL failed: %d";
LAB_00158369:
        Curl_failf(data,pcVar12,(ulong)uVar2);
        CVar8 = CURLE_SEND_ERROR;
      }
      break;
    case SMTP_RCPT:
      if (local_44 - 200 < 100) {
        bVar16 = false;
      }
      else {
        bVar16 = ((data->set).field_0x8c0 & 1) == 0;
      }
      pSVar3 = (data->req).p.smtp;
      if (local_44 - 200 < 100) {
        pSVar3->field_0x28 = pSVar3->field_0x28 | 1;
        CVar8 = CURLE_OK;
      }
      else {
        pSVar3->rcpt_last_error = local_44;
        CVar8 = CURLE_OK;
        if (bVar16) {
          Curl_failf(data,"RCPT failed: %d",(ulong)local_44);
          CVar8 = CURLE_SEND_ERROR;
        }
      }
      if (!bVar16) {
        pcVar4 = pSVar3->rcpt->next;
        pSVar3->rcpt = pcVar4;
        if (pcVar4 != (curl_slist *)0x0) goto LAB_0015834c;
        if ((pSVar3->field_0x28 & 1) == 0) {
          pcVar12 = "RCPT failed: %d (last error)";
          uVar2 = pSVar3->rcpt_last_error;
          goto LAB_00158369;
        }
        CVar8 = Curl_pp_sendf(data,&(pp->ftpc).pp,"%s","DATA");
        if (CVar8 == CURLE_OK) {
          smtp_state(data,SMTP_DATA);
          goto LAB_00158496;
        }
      }
      break;
    case SMTP_DATA:
      if (local_44 != 0x162) {
        pcVar12 = "DATA failed: %d";
        goto LAB_00158369;
      }
      Curl_pgrsSetUploadSize(data,(data->state).infilesize);
      CVar8 = CURLE_OK;
      Curl_xfer_setup1(data,2,-1,false);
      goto LAB_00158146;
    case SMTP_POSTDATA:
      CVar8 = (uint)(local_44 != 0xfa) << 3;
LAB_00158146:
      sVar11 = SMTP_STOP;
LAB_0015814b:
      smtp_state(data,sVar11);
    }
    if (CVar8 != CURLE_OK) {
      return CVar8;
    }
    if ((conn->proto).smtpc.state == SMTP_STOP) {
      return CURLE_OK;
    }
    _Var6 = Curl_pp_moredata(&(pp->ftpc).pp);
    if (!_Var6) {
      return CURLE_OK;
    }
  } while( true );
LAB_0015854a:
  if ((conn->proto).smtpc.state == SMTP_UPGRADETLS) goto LAB_00157e78;
  goto LAB_00157ea3;
  while (uVar9 = uVar9 + 1, uVar10 = -lVar15, uVar9 < (ulong)-lVar15) {
LAB_00158283:
    if (((ulong)pbVar13[uVar9] < 0x21) &&
       (uVar10 = uVar9, (0x100002600U >> ((ulong)pbVar13[uVar9] & 0x3f) & 1) != 0)) break;
  }
  uVar7 = Curl_sasl_decode_mech((char *)pbVar13,uVar10,(size_t *)&local_50);
  if ((uVar7 != 0) && (CONCAT44(uStack_4c,local_50) == uVar10)) {
    puVar1 = (ushort *)((long)&conn->proto + 0xb8);
    *puVar1 = *puVar1 | uVar7;
  }
  pbVar14 = pbVar13 + uVar10;
  lVar15 = -(lVar15 + uVar10);
LAB_00158270:
  pbVar13 = pbVar14;
  if (bVar16) goto LAB_001584b0;
  goto LAB_00158230;
}

Assistant:

static CURLcode smtp_statemachine(struct Curl_easy *data,
                                  struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  int smtpcode;
  struct smtp_conn *smtpc = &conn->proto.smtpc;
  struct pingpong *pp = &smtpc->pp;
  size_t nread = 0;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not SMTP */
upgrade_tls:
  if(smtpc->state == SMTP_UPGRADETLS)
    return smtp_perform_upgrade_tls(data);

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(data, pp);

  do {
    /* Read the response from the server */
    result = Curl_pp_readresp(data, FIRSTSOCKET, pp, &smtpcode, &nread);
    if(result)
      return result;

    /* Store the latest response for later retrieval if necessary */
    if(smtpc->state != SMTP_QUIT && smtpcode != 1)
      data->info.httpcode = smtpcode;

    if(!smtpcode)
      break;

    /* We have now received a full SMTP server response */
    switch(smtpc->state) {
    case SMTP_SERVERGREET:
      result = smtp_state_servergreet_resp(data, smtpcode, smtpc->state);
      break;

    case SMTP_EHLO:
      result = smtp_state_ehlo_resp(data, conn, smtpcode, smtpc->state);
      break;

    case SMTP_HELO:
      result = smtp_state_helo_resp(data, smtpcode, smtpc->state);
      break;

    case SMTP_STARTTLS:
      result = smtp_state_starttls_resp(data, smtpcode, smtpc->state);
      /* During UPGRADETLS, leave the read loop as we need to connect
       * (e.g. TLS handshake) before we continue sending/receiving. */
      if(!result && (smtpc->state == SMTP_UPGRADETLS))
        goto upgrade_tls;
      break;

    case SMTP_AUTH:
      result = smtp_state_auth_resp(data, smtpcode, smtpc->state);
      break;

    case SMTP_COMMAND:
      result = smtp_state_command_resp(data, smtpcode, smtpc->state);
      break;

    case SMTP_MAIL:
      result = smtp_state_mail_resp(data, smtpcode, smtpc->state);
      break;

    case SMTP_RCPT:
      result = smtp_state_rcpt_resp(data, conn, smtpcode, smtpc->state);
      break;

    case SMTP_DATA:
      result = smtp_state_data_resp(data, smtpcode, smtpc->state);
      break;

    case SMTP_POSTDATA:
      result = smtp_state_postdata_resp(data, smtpcode, smtpc->state);
      break;

    case SMTP_QUIT:
    default:
      /* internal error */
      smtp_state(data, SMTP_STOP);
      break;
    }
  } while(!result && smtpc->state != SMTP_STOP && Curl_pp_moredata(pp));

  return result;
}